

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall World::World(World *this)

{
  File_logger *this_00;
  Datetime_formatter *this_01;
  string local_88;
  string local_68;
  shared_ptr<util::logging::Formatter> local_48;
  
  this->_vptr_World = (_func_int **)&PTR__World_0011d4f8;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (File_logger *)operator_new(0x60);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"genfunop.log","");
  this_01 = (Datetime_formatter *)operator_new(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"%Y-%m-%dT%H:%M:%S%z","");
  util::logging::Datetime_formatter::Datetime_formatter(this_01,&local_68);
  boost::shared_ptr<util::logging::Formatter>::shared_ptr<util::logging::Datetime_formatter>
            (&local_48,this_01);
  util::logging::File_logger::File_logger(this_00,&local_88,&local_48,0x7f);
  boost::shared_ptr<util::logging::File_logger>::shared_ptr<util::logging::File_logger>
            (&this->LOGFILE,this_00);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

World::World() :
	LOGFILE(new util::logging::File_logger())
{
}